

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  int iVar1;
  ImGuiContext_conflict1 *pIVar2;
  bool bVar3;
  _Bool _Var4;
  bool bVar5;
  int iVar6;
  ImGui *this;
  float fVar7;
  float fVar8;
  char *item_text;
  ImGuiListClipper clipper;
  ImVec2 size;
  ImGui *local_70;
  ImGuiListClipper local_64;
  ImGuiContext_conflict1 *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  iVar6 = 7;
  if (items_count < 7) {
    iVar6 = items_count;
  }
  if (-1 < height_in_items) {
    iVar6 = height_in_items;
  }
  fVar7 = GetTextLineHeightWithSpacing();
  local_48 = pIVar2;
  fVar8 = (pIVar2->Style).FramePadding.y;
  local_38.y = (float)(int)(fVar7 * ((float)iVar6 + 0.25) + fVar8 + fVar8);
  local_38.x = 0.0;
  bVar3 = BeginListBox(label,&local_38);
  if (bVar3) {
    ImGuiListClipper::ImGuiListClipper(&local_64);
    fVar8 = GetTextLineHeightWithSpacing();
    ImGuiListClipper::Begin(&local_64,items_count,fVar8);
    bVar3 = false;
    while (_Var4 = ImGuiListClipper::Step(&local_64), iVar6 = local_64.DisplayStart, _Var4) {
      for (; iVar6 < local_64.DisplayEnd; iVar6 = iVar6 + 1) {
        bVar5 = (*items_getter)(data,iVar6,(char **)&local_70);
        if (!bVar5) {
          local_70 = (ImGui *)0x29c42f;
        }
        PushID(iVar6);
        iVar1 = *current_item;
        local_40.x = 0.0;
        local_40.y = 0.0;
        this = local_70;
        bVar5 = Selectable((char *)local_70,iVar6 == iVar1,0,&local_40);
        if (bVar5) {
          *current_item = iVar6;
          bVar3 = true;
        }
        if (iVar6 == iVar1) {
          SetItemDefaultFocus(this);
        }
        PopID();
      }
    }
    EndListBox();
    if (bVar3 != false) {
      MarkItemEdited((local_48->LastItemData).ID);
    }
    ImGuiListClipper::~ImGuiListClipper(&local_64);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Calculate size from "height_in_items"
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    float height_in_items_f = height_in_items + 0.25f;
    ImVec2 size(0.0f, ImFloor(GetTextLineHeightWithSpacing() * height_in_items_f + g.Style.FramePadding.y * 2.0f));

    if (!BeginListBox(label, size))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different height,
    // you can create a custom version of ListBox() in your code without using the clipper.
    bool value_changed = false;
    ImGuiListClipper clipper;
    clipper.Begin(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            const bool item_selected = (i == *current_item);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    EndListBox();

    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}